

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O2

void __thiscall CHud::RenderGameTimer(CHud *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ITextRender *pIVar5;
  int iVar6;
  int iVar7;
  int64 iVar8;
  int64 iVar9;
  CGameClient *pCVar10;
  char *pcVar11;
  CNetObj_GameData *pCVar12;
  IClient *pIVar13;
  long in_FS_OFFSET;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar14;
  undefined4 local_50;
  char aBuf [32];
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar10 = (this->super_CComponent).m_pClient;
  pCVar12 = (pCVar10->m_Snap).m_pGameData;
  uVar1 = pCVar12->m_GameStateFlags;
  pIVar13 = (IClient *)(ulong)uVar1;
  iVar7 = 0;
  if ((uVar1 & 2) == 0) {
    iVar2 = (pCVar10->m_GameInfo).m_TimeLimit;
    if (iVar2 == 0 || (uVar1 & 1) != 0) {
      if ((uVar1 & 0xc) == 0) {
        pIVar13 = pCVar10->m_pClient;
        iVar7 = pIVar13->m_CurGameTick - pCVar12->m_GameStartTick;
      }
      else {
        iVar7 = pCVar12->m_GameStateEndTick;
        pIVar13 = pCVar10->m_pClient;
      }
      pCVar12 = (CNetObj_GameData *)(ulong)(uint)(iVar7 % pIVar13->m_GameTickSpeed);
      iVar7 = iVar7 / pIVar13->m_GameTickSpeed;
    }
    else {
      iVar6 = pCVar10->m_pClient->m_CurGameTick - pCVar12->m_GameStartTick;
      iVar3 = pCVar10->m_pClient->m_GameTickSpeed;
      pCVar12 = (CNetObj_GameData *)((long)iVar6 % (long)iVar3 & 0xffffffff);
      iVar7 = 0;
      if ((uVar1 & 0xc) == 0) {
        iVar7 = iVar2 * 0x3c - iVar6 / iVar3;
      }
    }
  }
  iVar2 = pCVar10->m_pGraphics->m_ScreenWidth;
  iVar3 = pCVar10->m_pGraphics->m_ScreenHeight;
  if ((RenderGameTimer()::s_Cursor == '\0') &&
     (iVar6 = __cxa_guard_acquire(&RenderGameTimer()::s_Cursor,pIVar13,pCVar12), iVar6 != 0)) {
    CTextCursor::CTextCursor(&RenderGameTimer::s_Cursor,10.0,0);
    __cxa_atexit(CTextCursor::~CTextCursor,&RenderGameTimer::s_Cursor,&__dso_handle);
    __cxa_guard_release(&RenderGameTimer()::s_Cursor);
  }
  aVar14.x = ((float)iVar2 / (float)iVar3) * 300.0 * 0.5;
  RenderGameTimer::s_Cursor.m_CursorPos.field_1.y = 2.0;
  RenderGameTimer::s_Cursor.m_Align = 1;
  RenderGameTimer::s_Cursor.m_CursorPos.field_0.x = aVar14.x;
  CTextCursor::Reset(&RenderGameTimer::s_Cursor,(long)iVar7);
  str_format(aBuf,0x20,"%d:%02d",(long)iVar7 / 0x3c & 0xffffffff,(long)iVar7 % 0x3c & 0xffffffff);
  pCVar10 = (this->super_CComponent).m_pClient;
  if ((((pCVar10->m_GameInfo).m_TimeLimit == 0) || (0x3c < iVar7)) ||
     ((((pCVar10->m_Snap).m_pGameData)->m_GameStateFlags & 1) != 0)) {
    local_50 = 0x3f800000;
  }
  else {
    if (iVar7 < 0xb) {
      iVar8 = time_get();
      iVar9 = time_freq();
      local_50 = *(undefined4 *)(&DAT_001c9a14 + (ulong)(((iVar8 * 2) / iVar9 & 1U) == 0) * 4);
      pCVar10 = (this->super_CComponent).m_pClient;
    }
    else {
      local_50 = 0x3f800000;
    }
    (*(pCVar10->m_pTextRender->super_IInterface)._vptr_IInterface[4])
              (0x3f800000,0x3e800000,0x3e800000,0x3f800000);
    pCVar10 = (this->super_CComponent).m_pClient;
  }
  (*(pCVar10->m_pTextRender->super_IInterface)._vptr_IInterface[7])
            (pCVar10->m_pTextRender,&RenderGameTimer::s_Cursor,aBuf,0xffffffff);
  pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x10])
            (local_50,pIVar5,&RenderGameTimer::s_Cursor,0,0xffffffff);
  (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
            (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
  if ((((((this->super_CComponent).m_pClient)->m_Snap).m_pGameData)->m_GameStateFlags & 2) != 0) {
    if ((RenderGameTimer()::s_SuddenDeathCursor == '\0') &&
       (iVar7 = __cxa_guard_acquire(&RenderGameTimer()::s_SuddenDeathCursor), iVar7 != 0)) {
      CTextCursor::CTextCursor(&RenderGameTimer::s_SuddenDeathCursor,12.0,0);
      __cxa_atexit(CTextCursor::~CTextCursor,&RenderGameTimer::s_SuddenDeathCursor,&__dso_handle);
      __cxa_guard_release(&RenderGameTimer()::s_SuddenDeathCursor);
    }
    RenderGameTimer::s_SuddenDeathCursor.m_CursorPos.field_1.y = 14.0;
    RenderGameTimer::s_SuddenDeathCursor.m_Align = 1;
    RenderGameTimer::s_SuddenDeathCursor.m_CursorPos.field_0.x = aVar14.x;
    CTextCursor::Reset(&RenderGameTimer::s_SuddenDeathCursor,(long)g_Localization.m_CurrentVersion);
    pcVar11 = Localize("Sudden Death","");
    pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    (*(pIVar5->super_IInterface)._vptr_IInterface[0xb])
              (pIVar5,&RenderGameTimer::s_SuddenDeathCursor,pcVar11,0xffffffffffffffff);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CHud::RenderGameTimer()
{
	float x = 300.0f*Graphics()->ScreenAspect()/2.0f;

	int Time = 0;
	if(m_pClient->m_Snap.m_pGameData->m_GameStateFlags&GAMESTATEFLAG_SUDDENDEATH)
		Time = 0;
	else if(m_pClient->m_GameInfo.m_TimeLimit && !(m_pClient->m_Snap.m_pGameData->m_GameStateFlags&GAMESTATEFLAG_WARMUP))
	{
		Time = m_pClient->m_GameInfo.m_TimeLimit*60 - ((Client()->GameTick()-m_pClient->m_Snap.m_pGameData->m_GameStartTick)/Client()->GameTickSpeed());

		if(m_pClient->m_Snap.m_pGameData->m_GameStateFlags&(GAMESTATEFLAG_ROUNDOVER|GAMESTATEFLAG_GAMEOVER))
			Time = 0;
	}
	else if(m_pClient->m_Snap.m_pGameData->m_GameStateFlags&(GAMESTATEFLAG_ROUNDOVER|GAMESTATEFLAG_GAMEOVER))
		Time = m_pClient->m_Snap.m_pGameData->m_GameStateEndTick/Client()->GameTickSpeed();
	else
		Time = (Client()->GameTick()-m_pClient->m_Snap.m_pGameData->m_GameStartTick)/Client()->GameTickSpeed();

	static CTextCursor s_Cursor(10.0f);
	s_Cursor.MoveTo(x, 2.0f);
	s_Cursor.m_Align = TEXTALIGN_TC;
	s_Cursor.Reset(Time);

	char aBuf[32];
	str_format(aBuf, sizeof(aBuf), "%d:%02d", Time/60, Time%60);

	// last 60 sec red, last 10 sec blink
	float Alpha = 1.0f;
	if(m_pClient->m_GameInfo.m_TimeLimit && Time <= 60 && !(m_pClient->m_Snap.m_pGameData->m_GameStateFlags&GAMESTATEFLAG_WARMUP))
	{
		Alpha = Time <= 10 && (2*time_get()/time_freq()) % 2 ? 0.5f : 1.0f;
		TextRender()->TextColor(1.0f, 0.25f, 0.25f, 1.0f);
	}
	TextRender()->TextDeferred(&s_Cursor, aBuf, -1.0f);
	TextRender()->DrawTextOutlined(&s_Cursor, Alpha);
	TextRender()->TextColor(1.0f, 1.0f, 1.0f, 1.0f);

	if(m_pClient->m_Snap.m_pGameData->m_GameStateFlags&GAMESTATEFLAG_SUDDENDEATH)
	{
		static CTextCursor s_SuddenDeathCursor(12.0f);
		s_SuddenDeathCursor.MoveTo(x, 14.0f);
		s_SuddenDeathCursor.m_Align = TEXTALIGN_TC;
		s_SuddenDeathCursor.Reset(g_Localization.Version());
		const char *pText = Localize("Sudden Death");
		TextRender()->TextOutlined(&s_SuddenDeathCursor, pText, -1);
	}
}